

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall wallet::LegacyDataSPKM::AddWatchOnlyInMem(LegacyDataSPKM *this,CScript *dest)

{
  long lVar1;
  bool bVar2;
  mapped_type *__dest;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock28;
  CKeyID local_6d;
  CPubKey pubKey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock28,&(this->super_FillableSigningProvider).cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x3a6,false);
  std::_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
  ::_M_insert_unique<CScript_const&>
            ((_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
              *)&this->setWatchOnly,dest);
  pubKey.vch[0] = 0xff;
  bVar2 = ExtractPubKey(dest,&pubKey);
  if (bVar2) {
    CPubKey::GetID(&local_6d,&pubKey);
    __dest = std::
             map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
             ::operator[](&this->mapWatchKeys,&local_6d);
    memcpy(__dest,&pubKey,0x41);
    FillableSigningProvider::ImplicitlyLearnRelatedKeyScripts
              (&this->super_FillableSigningProvider,&pubKey);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock28.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::AddWatchOnlyInMem(const CScript &dest)
{
    LOCK(cs_KeyStore);
    setWatchOnly.insert(dest);
    CPubKey pubKey;
    if (ExtractPubKey(dest, pubKey)) {
        mapWatchKeys[pubKey.GetID()] = pubKey;
        ImplicitlyLearnRelatedKeyScripts(pubKey);
    }
    return true;
}